

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strings.h
# Opt level: O2

string * join<std::vector<flow::Instr*,std::allocator<flow::Instr*>>>
                   (string *__return_storage_ptr__,
                   vector<flow::Instr_*,_std::allocator<flow::Instr_*>_> *list,string *separator,
                   offset_in_type_to_subr mapfn)

{
  pointer ppIVar1;
  string *psVar2;
  Instr **item;
  pointer ppIVar4;
  long in_R8;
  int iVar5;
  bool bVar6;
  stringstream sstr;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  code *pcVar3;
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  ppIVar1 = (list->super__Vector_base<flow::Instr_*,_std::allocator<flow::Instr_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  iVar5 = 0;
  for (ppIVar4 = (list->super__Vector_base<flow::Instr_*,_std::allocator<flow::Instr_*>_>)._M_impl.
                 super__Vector_impl_data._M_start; ppIVar4 != ppIVar1; ppIVar4 = ppIVar4 + 1) {
    bVar6 = iVar5 != 0;
    iVar5 = iVar5 + -1;
    if (bVar6) {
      std::operator<<(local_1a8,(string *)separator);
    }
    pcVar3 = (code *)mapfn;
    if ((mapfn & 1) != 0) {
      pcVar3 = *(code **)(*(long *)((long)&((*ppIVar4)->super_Value)._vptr_Value + in_R8) + -1 +
                         mapfn);
    }
    psVar2 = (string *)(*pcVar3)();
    std::operator<<(local_1a8,psVar2);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

std::string join(
    const Container& list,
    const std::string& separator,
    const std::string& (std::remove_pointer<typename Container::value_type>::type::* mapfn)() const) {
  std::stringstream sstr;
  int i = 0;
  for (const auto& item: list) {
    if (i) {
      sstr << separator;
    }
    if constexpr (std::is_pointer<typename Container::value_type>::value) {
      sstr << (item->*mapfn)();
    } else {
      sstr << (item.*mapfn)();
    }
    i++;
  }
  return sstr.str();
}